

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  value_type pCVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar4;
  reference ppCVar5;
  const_reference ppCVar6;
  ulong local_28;
  size_t i;
  AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  *other_local;
  AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  *this_local;
  
  iVar2 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[10])();
  iVar3 = (*(other->super_ThreadSafe)._vptr_ThreadSafe[10])();
  if (CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3)) {
    for (local_28 = 0;
        sVar4 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::size
                          (&this->m_list), local_28 < sVar4; local_28 = local_28 + 1) {
      ppCVar5 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::at
                          (&this->m_list,local_28);
      pCVar1 = *ppCVar5;
      ppCVar6 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::at
                          (&other->m_list,local_28);
      if (pCVar1 != *ppCVar6) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }